

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O2

int RSA_encrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  int iVar1;
  uint tlen;
  int iVar2;
  ulong size;
  tuple<bignum_ctx_*,_bssl::internal::Deleter> ctx_00;
  BIGNUM *ret;
  BIGNUM *r;
  uchar *to;
  BIGNUM *pBVar3;
  BN_MONT_CTX *pBVar4;
  long lVar5;
  long lVar6;
  uchar *buf;
  int iVar7;
  UniquePtr<BN_CTX> ctx;
  
  if ((rsa->n == (BIGNUM *)0x0) || (rsa->e == (BIGNUM *)0x0)) {
    iVar1 = 0x90;
    iVar7 = 0x157;
LAB_0026271b:
    ERR_put_error(4,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,iVar7);
    return 0;
  }
  iVar1 = rsa_check_public_key(rsa);
  if (iVar1 == 0) {
    return 0;
  }
  tlen = RSA_size((RSA *)rsa);
  size = (ulong)tlen;
  if (max_out < size) {
    iVar1 = 0x87;
    iVar7 = 0x161;
    goto LAB_0026271b;
  }
  ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>)BN_CTX_new();
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
       ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
  if (ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
    iVar1 = 0;
    goto LAB_002628a7;
  }
  BN_CTX_start((BN_CTX *)
               ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  ret = BN_CTX_get((BN_CTX *)
                   ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  r = BN_CTX_get((BN_CTX *)
                 ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
  to = (uchar *)OPENSSL_malloc(size);
  iVar7 = 0;
  iVar1 = iVar7;
  if (to != (uchar *)0x0 && (r != (BIGNUM *)0x0 && ret != (BIGNUM *)0x0)) {
    if (padding != 4) {
      if (padding == 3) {
        iVar2 = RSA_padding_add_none(to,tlen,in,(int)in_len);
        goto LAB_0026282e;
      }
      if (padding == 1) {
        if (tlen < 0xb) {
          iVar1 = 0x7e;
          iVar7 = 0xe0;
          goto LAB_00262890;
        }
        if (size - 0xb < in_len) {
          iVar1 = 0x72;
          iVar7 = 0xe5;
          goto LAB_00262890;
        }
        to[0] = '\0';
        to[1] = '\x02';
        lVar6 = (size - in_len) + -3;
        buf = to + 2;
        RAND_bytes(buf,(int)lVar6);
        for (lVar5 = 0; lVar5 != lVar6; lVar5 = lVar5 + 1) {
          while (buf[lVar5] == '\0') {
            RAND_bytes(buf + lVar5,1);
          }
        }
        to[(size - in_len) + -1] = '\0';
        if (in_len != 0) {
          memcpy(to + (size - in_len),in,in_len);
        }
        goto LAB_00262837;
      }
      iVar1 = 0x8f;
      iVar7 = 0x180;
      goto LAB_00262890;
    }
    iVar2 = RSA_padding_add_PKCS1_OAEP_mgf1
                      (to,size,in,in_len,(uint8_t *)0x0,0,(EVP_MD *)0x0,(EVP_MD *)0x0);
LAB_0026282e:
    if (0 < iVar2) {
LAB_00262837:
      pBVar3 = BN_bin2bn(to,tlen,ret);
      iVar1 = 0;
      if (pBVar3 != (BIGNUM *)0x0) {
        iVar2 = BN_ucmp(ret,(BIGNUM *)rsa->n);
        if (iVar2 < 0) {
          pBVar4 = BN_MONT_CTX_set_locked
                             ((BN_MONT_CTX **)&rsa->mont_n,(int)rsa + 0x58,(BIGNUM *)rsa->n,
                              (BN_CTX *)
                              ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          if (((int)pBVar4 != 0) &&
             (iVar2 = BN_mod_exp_mont(r,ret,(BIGNUM *)rsa->e,
                                      (BIGNUM *)&(((BN_MONT_CTX *)rsa->mont_n)->RR).neg,
                                      (BN_CTX *)
                                      ctx_00.
                                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                      (BN_MONT_CTX *)rsa->mont_n), iVar1 = iVar7, iVar2 != 0)) {
            iVar1 = BN_bn2bin_padded(out,size,(BIGNUM *)r);
            if (iVar1 == 0) {
              iVar1 = 0x44;
              iVar7 = 0x19b;
              goto LAB_00262890;
            }
            *out_len = size;
            iVar1 = 1;
          }
        }
        else {
          iVar1 = 0x73;
          iVar7 = 0x18e;
LAB_00262890:
          ERR_put_error(4,0,iVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                        ,iVar7);
          iVar1 = 0;
        }
      }
    }
  }
  OPENSSL_free(to);
  BN_CTX_end((BN_CTX *)
             ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
LAB_002628a7:
  std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return iVar1;
}

Assistant:

int RSA_encrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->n == NULL || rsa->e == NULL) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_VALUE_MISSING);
    return 0;
  }

  if (!rsa_check_public_key(rsa)) {
    return 0;
  }

  const unsigned rsa_size = RSA_size(rsa);
  if (max_out < rsa_size) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_OUTPUT_BUFFER_TOO_SMALL);
    return 0;
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }

  bssl::BN_CTXScope scope(ctx.get());
  BIGNUM *f = BN_CTX_get(ctx.get());
  BIGNUM *result = BN_CTX_get(ctx.get());
  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(rsa_size));
  int i, ret = 0;
  if (!f || !result || !buf) {
    goto err;
  }

  switch (padding) {
    case RSA_PKCS1_PADDING:
      i = rsa_padding_add_PKCS1_type_2(buf, rsa_size, in, in_len);
      break;
    case RSA_PKCS1_OAEP_PADDING:
      // Use the default parameters: SHA-1 for both hashes and no label.
      i = RSA_padding_add_PKCS1_OAEP_mgf1(buf, rsa_size, in, in_len, nullptr, 0,
                                          nullptr, nullptr);
      break;
    case RSA_NO_PADDING:
      i = RSA_padding_add_none(buf, rsa_size, in, in_len);
      break;
    default:
      OPENSSL_PUT_ERROR(RSA, RSA_R_UNKNOWN_PADDING_TYPE);
      goto err;
  }

  if (i <= 0) {
    goto err;
  }

  if (BN_bin2bn(buf, rsa_size, f) == nullptr) {
    goto err;
  }

  if (BN_ucmp(f, rsa->n) >= 0) {
    // usually the padding functions would catch this
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_MODULUS);
    goto err;
  }

  if (!BN_MONT_CTX_set_locked(&rsa->mont_n, &rsa->lock, rsa->n, ctx.get()) ||
      !BN_mod_exp_mont(result, f, rsa->e, &rsa->mont_n->N, ctx.get(),
                       rsa->mont_n)) {
    goto err;
  }

  // put in leading 0 bytes if the number is less than the length of the
  // modulus
  if (!BN_bn2bin_padded(out, rsa_size, result)) {
    OPENSSL_PUT_ERROR(RSA, ERR_R_INTERNAL_ERROR);
    goto err;
  }

  *out_len = rsa_size;
  ret = 1;

err:
  OPENSSL_free(buf);
  return ret;
}